

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

GLRState * __thiscall GLRParser::findState(GLRParser *this,string *stateName)

{
  pointer __s2;
  size_t sVar1;
  size_t __n;
  int iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  GLRState *pGVar5;
  bool bVar6;
  
  iVar2 = std::__cxx11::string::compare((char *)stateName);
  if (iVar2 == 0) {
    pGVar5 = this->acceptState;
  }
  else {
    p_Var3 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(this->states)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      __s2 = (stateName->_M_dataplus)._M_p;
      sVar1 = stateName->_M_string_length;
      do {
        pGVar5 = *(GLRState **)(p_Var3 + 1);
        __n = (pGVar5->name)._M_string_length;
        if (__n == sVar1) {
          if (__n == 0) {
            bVar6 = true;
          }
          else {
            iVar2 = bcmp((pGVar5->name)._M_dataplus._M_p,__s2,__n);
            bVar6 = iVar2 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if (bVar6) {
          return pGVar5;
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var4);
    }
    pGVar5 = (GLRState *)0x0;
  }
  return pGVar5;
}

Assistant:

GLRState *GLRParser::findState(const std::string &stateName) {
//    return *std::find(states.begin(), states.end(), stateName);
    if (stateName == "accept") {
        return acceptState;
    }


    for (GLRState *state: states) {
        if (state->getName() == stateName) {
            return state;
        }
    }


    return nullptr;
}